

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7Dec.c
# Opt level: O0

Bool_conflict Ppmd7z_RangeDec_Init(CPpmd7z_RangeDec *p)

{
  int iVar1;
  char cVar2;
  byte bVar3;
  long in_RDI;
  uint i;
  undefined4 local_14;
  undefined4 local_4;
  
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  *(undefined4 *)(in_RDI + 0x18) = 0xffffffff;
  cVar2 = (*(code *)**(undefined8 **)(in_RDI + 0x20))(*(undefined8 *)(in_RDI + 0x20));
  if (cVar2 == '\0') {
    for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
      iVar1 = *(int *)(in_RDI + 0x1c);
      bVar3 = (*(code *)**(undefined8 **)(in_RDI + 0x20))(*(undefined8 *)(in_RDI + 0x20));
      *(uint *)(in_RDI + 0x1c) = iVar1 << 8 | (uint)bVar3;
    }
    local_4 = (uint)(*(int *)(in_RDI + 0x1c) != -1);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

Bool Ppmd7z_RangeDec_Init(CPpmd7z_RangeDec *p)
{
  unsigned i;
  p->Code = 0;
  p->Range = 0xFFFFFFFF;
  if (p->Stream->Read((void *)p->Stream) != 0)
    return False;
  for (i = 0; i < 4; i++)
    p->Code = (p->Code << 8) | p->Stream->Read((void *)p->Stream);
  return (p->Code < 0xFFFFFFFF);
}